

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O0

Cluster ** __thiscall
AddressMap<std::pair<int,unsigned_long>>::New<AddressMap<std::pair<int,unsigned_long>>::Cluster*>
          (AddressMap<std::pair<int,unsigned_long>> *this,int num)

{
  undefined8 *__s;
  Object *obj;
  void *ptr;
  int num_local;
  AddressMap<std::pair<int,_unsigned_long>_> *this_local;
  
  __s = (undefined8 *)(**(code **)(this + 0x10))((long)num * 8 + 8);
  memset(__s,0,(long)num * 8 + 8);
  *__s = *(undefined8 *)(this + 0x20);
  *(undefined8 **)(this + 0x20) = __s;
  return (Cluster **)(__s + 1);
}

Assistant:

T* New(int num) {
    void* ptr = (*alloc_)(sizeof(Object) + num*sizeof(T));
    memset(ptr, 0, sizeof(Object) + num*sizeof(T));
    Object* obj = reinterpret_cast<Object*>(ptr);
    obj->next = allocated_;
    allocated_ = obj;
    return reinterpret_cast<T*>(reinterpret_cast<Object*>(ptr) + 1);
  }